

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void writePic<PicHeaderSwitch>(ostream *stream,PicHeader *header,istream *reference)

{
  bool bVar1;
  ostream *in_RDX;
  long in_RSI;
  PicChunkSwitch *in_RDI;
  Chunk c;
  PicChunk *chunk;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PicChunk,_std::allocator<PicChunk>_> *__range1;
  PicHeaderSwitch h;
  int in_stack_00000194;
  istream *in_stack_00000198;
  ostream *in_stack_000001a0;
  PicHeaderSwitch *in_stack_ffffffffffffff88;
  PicChunkSwitch *thing;
  ostream *in_stack_ffffffffffffff90;
  ostream *stream_00;
  uint32_t in_stack_ffffffffffffff98;
  uint16_t in_stack_ffffffffffffff9c;
  uint16_t in_stack_ffffffffffffff9e;
  PicChunkSwitch *in_stack_ffffffffffffffa0;
  __normal_iterator<const_PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_> local_48;
  long local_40;
  ostream *local_18;
  long local_10;
  PicChunkSwitch *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::istream::seekg((long)in_RDX,_S_beg);
  readRaw<PicHeaderSwitch>((istream *)in_stack_ffffffffffffff90);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::operator=((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *
              )in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff90,(unsigned_short)((ulong)in_stack_ffffffffffffff88 >> 0x30)
            );
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff90,(unsigned_short)((ulong)in_stack_ffffffffffffff88 >> 0x30)
            );
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff90,(unsigned_short)((ulong)in_stack_ffffffffffffff88 >> 0x30)
            );
  boost::endian::
  endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::operator=
            ((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
              *)in_stack_ffffffffffffff90,(unsigned_short)((ulong)in_stack_ffffffffffffff88 >> 0x30)
            );
  std::vector<PicChunk,_std::allocator<PicChunk>_>::size
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)(local_10 + 0x18));
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::operator=((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *
              )in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  writeRaw<PicHeaderSwitch>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  PicHeaderSwitch::bytesToSkip((PicHeaderSwitch *)0x117dea);
  copyBytes(in_stack_000001a0,in_stack_00000198,in_stack_00000194);
  local_40 = local_10 + 0x18;
  local_48._M_current =
       (PicChunk *)
       std::vector<PicChunk,_std::allocator<PicChunk>_>::begin
                 ((vector<PicChunk,_std::allocator<PicChunk>_> *)local_8);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::end
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)local_8);
  thing = local_8;
  stream_00 = local_18;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                        *)stream_00,
                       (__normal_iterator<const_PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                        *)thing);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
    operator*(&local_48);
    PicChunkSwitch::PicChunkSwitch
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c,
               in_stack_ffffffffffffff98,(uint32_t)((ulong)stream_00 >> 0x20));
    writeRaw<PicChunkSwitch>(stream_00,thing);
    __gnu_cxx::
    __normal_iterator<const_PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
    operator++(&local_48);
  }
  return;
}

Assistant:

void writePic(std::ostream& stream, const PicHeader& header, std::istream& reference) {
	reference.seekg(0, reference.beg);
	Header h = readRaw<Header>(reference);
	h.filesize = header.filesize;
	h.ew = header.ew;
	h.eh = header.eh;
	h.width = header.width;
	h.height = header.height;
	h.chunks = header.chunks.size();
	writeRaw(stream, h);
	copyBytes(stream, reference, h.bytesToSkip());
	for (const auto& chunk : header.chunks) {
		typename Header::Chunk c(chunk.x, chunk.y, chunk.offset, chunk.size);
		writeRaw(stream, c);
	}
}